

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

MockableDatabase * wallet::GetMockableDatabase(CWallet *wallet)

{
  long lVar1;
  WalletDatabase *pWVar2;
  MockableDatabase *pMVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (wallet->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar2 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  pMVar3 = (MockableDatabase *)
           __dynamic_cast(pWVar2,&WalletDatabase::typeinfo,&MockableDatabase::typeinfo,0);
  if (pMVar3 == (MockableDatabase *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_bad_cast();
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pMVar3;
  }
  __stack_chk_fail();
}

Assistant:

MockableDatabase& GetMockableDatabase(CWallet& wallet)
{
    return dynamic_cast<MockableDatabase&>(wallet.GetDatabase());
}